

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.c
# Opt level: O0

void chck_pool_flush(chck_pool *pool)

{
  chck_pool *pool_local;
  
  if (pool != (chck_pool *)0x0) {
    pool_buffer_flush(&pool->items,true);
    pool_buffer_flush(&pool->map,true);
    pool_buffer_flush(&pool->removed,true);
    return;
  }
  __assert_fail("pool",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/pool/pool.c",
                0x13b,"void chck_pool_flush(struct chck_pool *)");
}

Assistant:

void
chck_pool_flush(struct chck_pool *pool)
{
   assert(pool);
   pool_buffer_flush(&pool->items, true);
   pool_buffer_flush(&pool->map, true);
   pool_buffer_flush(&pool->removed, true);
}